

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorUtils.H
# Opt level: O0

void __thiscall
pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::flatten
          (FlattenOps<pele::physics::reactions::utils::YCOrder> *this,Box *box,int ncells,
          int reactor_type,bool clean_init_massfrac,Array4<const_double> *rhoY,
          Array4<const_double> *frcExt,Array4<const_double> *temperature,Array4<const_double> *rhoE,
          Array4<const_double> *frcEExt,Real *y_vect,Real *src_vect,Real *vect_energy,
          Real *src_vect_energy)

{
  int *in_RSI;
  byte in_R8B;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  undefined8 in_stack_00000040;
  Dim3 lo;
  Dim3 len;
  undefined1 auStackY_298 [32];
  anon_class_392_14_f0a3f212 *in_stack_fffffffffffffd88;
  Box *in_stack_fffffffffffffd90;
  undefined1 auStack_258 [64];
  undefined1 auStack_218 [64];
  undefined1 auStack_1d8 [64];
  undefined1 auStack_198 [88];
  undefined8 local_140;
  undefined8 local_138;
  int local_130;
  undefined8 local_124;
  int local_11c;
  undefined8 local_118;
  int local_110;
  undefined8 local_108;
  int local_100;
  byte local_e9;
  undefined8 local_d0;
  int local_c8;
  int local_b8;
  int iStack_b4;
  int local_b0;
  undefined4 local_ac;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  undefined4 local_5c;
  int *local_58;
  undefined8 local_50;
  int local_48;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_c;
  
  local_e9 = in_R8B & 1;
  local_58 = in_RSI + 3;
  local_5c = 0;
  local_6c = 0;
  local_b8 = (*local_58 - *in_RSI) + 1;
  local_78 = in_RSI + 3;
  local_7c = 1;
  local_8c = 1;
  iStack_b4 = (in_RSI[4] - in_RSI[1]) + 1;
  local_98 = in_RSI + 3;
  local_9c = 2;
  local_ac = 2;
  local_110 = (in_RSI[5] - in_RSI[2]) + 1;
  local_118 = CONCAT44(iStack_b4,local_b8);
  local_c = 0;
  local_38 = *in_RSI;
  local_1c = 1;
  iStack_34 = in_RSI[1];
  local_138 = *(undefined8 *)in_RSI;
  local_2c = 2;
  local_130 = in_RSI[2];
  local_124 = local_138;
  local_11c = local_130;
  local_108 = local_118;
  local_100 = local_110;
  local_d0 = local_118;
  local_c8 = local_110;
  local_b0 = local_110;
  local_50 = local_138;
  local_48 = local_130;
  local_30 = local_130;
  memcpy(auStackY_298,in_R9,0x3c);
  memcpy(auStack_258,in_stack_00000008,0x3c);
  memcpy(auStack_218,in_stack_00000010,0x3c);
  memcpy(auStack_1d8,in_stack_00000018,0x3c);
  memcpy(auStack_198,in_stack_00000020,0x3c);
  local_140 = in_stack_00000040;
  amrex::
  ParallelFor<pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::flatten(amrex::Box_const&,int,int,bool,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double*,double*,double*,double*)::_lambda(int,int,int)_1_>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  return;
}

Assistant:

void flatten(
    const amrex::Box& box,
    const int ncells,
    const int reactor_type,
    const bool clean_init_massfrac,
    amrex::Array4<const amrex::Real> const& rhoY,
    amrex::Array4<const amrex::Real> const& frcExt,
    amrex::Array4<const amrex::Real> const& temperature,
    amrex::Array4<const amrex::Real> const& rhoE,
    amrex::Array4<const amrex::Real> const& frcEExt,
    amrex::Real* y_vect,
    amrex::Real* src_vect,
    amrex::Real* vect_energy,
    amrex::Real* src_vect_energy)
  {
    BL_PROFILE("Pele::flatten()");
    const auto len = amrex::length(box);
    const auto lo = amrex::lbound(box);
    amrex::ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
      const int icell =
        (k - lo.z) * len.x * len.y + (j - lo.y) * len.x + (i - lo.x);
      box_flatten<OrderType>(
        icell, i, j, k, ncells, reactor_type, clean_init_massfrac, rhoY, frcExt,
        temperature, rhoE, frcEExt, y_vect, src_vect, vect_energy,
        src_vect_energy);
    });
  }